

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O1

bool __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::
AssignPointsToCorners
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder> *this,
          int num_connectivity_verts)

{
  pointer pAVar1;
  Mesh *pMVar2;
  undefined8 uVar3;
  int iVar4;
  CornerTable *pCVar5;
  MeshEdgebreakerDecoder *pMVar6;
  int c;
  long lVar7;
  ulong uVar8;
  long lVar9;
  undefined4 uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IVar16;
  ulong uVar17;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IVar18;
  FaceIndex FVar19;
  bool bVar20;
  vector<int,_std::allocator<int>_> point_to_corner_map;
  Face face_1;
  vector<int,_std::allocator<int>_> corner_to_point_map;
  uint local_7c;
  vector<int,_std::allocator<int>_> local_78;
  Face local_58;
  vector<int,_std::allocator<int>_> local_48;
  
  pCVar5 = (this->corner_table_)._M_t.
           super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>._M_t.
           super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
           super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffff00000000);
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  std::
  vector<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
  ::resize(&(((this->decoder_->super_MeshDecoder).mesh_)->faces_).vector_,
           (long)(int)((ulong)((long)*(pointer *)
                                      ((long)&(pCVar5->corner_to_vertex_map_).vector_ + 8) -
                               *(long *)&(pCVar5->corner_to_vertex_map_).vector_ >> 2) / 3),
           (value_type *)&local_78);
  if ((this->attribute_data_).
      super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->attribute_data_).
      super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pMVar6 = this->decoder_;
    pMVar2 = (pMVar6->super_MeshDecoder).mesh_;
    if ((int)((ulong)((long)(pMVar2->faces_).vector_.
                            super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pMVar2->faces_).vector_.
                           super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555 != 0) {
      lVar7 = 0;
      FVar19.value_ = 0;
      do {
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)((ulong)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish & 0xffffffff00000000);
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        pCVar5 = (this->corner_table_)._M_t.
                 super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                 .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
        lVar9 = 0;
        do {
          if ((int)(lVar7 + lVar9) == -1) {
            uVar10 = 0xffffffff;
          }
          else {
            uVar10 = *(undefined4 *)
                      (*(long *)&(pCVar5->corner_to_vertex_map_).vector_ +
                      (lVar7 + lVar9 & 0xffffffffU) * 4);
          }
          *(undefined4 *)
           ((long)&local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar9 * 4) = uVar10;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        Mesh::SetFace((pMVar6->super_MeshDecoder).mesh_,FVar19,(Face *)&local_78);
        FVar19.value_ = FVar19.value_ + 1;
        pMVar6 = this->decoder_;
        pMVar2 = (pMVar6->super_MeshDecoder).mesh_;
        lVar7 = lVar7 + 3;
      } while (FVar19.value_ <
               (uint)((int)((ulong)((long)(pMVar2->faces_).vector_.
                                          super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pMVar2->faces_).vector_.
                                         super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                     -0x55555555));
    }
    ((pMVar6->super_MeshDecoder).super_PointCloudDecoder.point_cloud_)->num_points_ =
         num_connectivity_verts;
    bVar20 = true;
  }
  else {
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (int *)0x0;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    pCVar5 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_48,
               (long)(int)((ulong)((long)*(pointer *)
                                          ((long)&(pCVar5->corner_to_vertex_map_).vector_ + 8) -
                                  *(long *)&(pCVar5->corner_to_vertex_map_).vector_) >> 2),
               (allocator_type *)&local_58);
    pCVar5 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    lVar7 = *(long *)&(pCVar5->vertex_corners_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ;
    bVar20 = true;
    if (0 < (int)((ulong)((long)*(pointer *)((long)&(pCVar5->vertex_corners_).vector_ + 8) - lVar7)
                 >> 2)) {
      uVar15 = 0;
      do {
        uVar13 = *(uint *)(lVar7 + uVar15 * 4);
        uVar17 = (ulong)uVar13;
        if (uVar17 == 0xffffffff) {
          iVar4 = 10;
        }
        else {
          if (((this->is_vert_hole_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar15 >> 6] >>
               (uVar15 & 0x3f) & 1) == 0) {
            pAVar1 = (this->attribute_data_).
                     super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar7 = (long)(this->attribute_data_).
                          super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1;
            local_7c = uVar13;
            if (lVar7 != 0) {
              uVar8 = (lVar7 >> 6) * -0x3333333333333333;
              uVar11 = 0;
              uVar12 = ((uVar13 * -0x55555555 < 0x55555556) - 1 | 2) + uVar13;
              do {
                uVar14 = *(uint *)(*(long *)&((pAVar1[uVar11].connectivity_data.corner_table_)->
                                             corner_to_vertex_map_).vector_.
                                             super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                  + uVar17 * 4);
                if ((*(ulong *)(*(long *)&pAVar1[uVar11].connectivity_data.is_vertex_on_seam_.
                                          super__Bvector_base<std::allocator<bool>_>._M_impl.
                                          super__Bvector_impl_data + (ulong)(uVar14 >> 6) * 8) >>
                     ((ulong)uVar14 & 0x3f) & 1) != 0) {
                  uVar14 = uVar12;
                  if (uVar12 != 0xffffffff) {
                    uVar14 = *(uint *)(*(long *)&(pCVar5->opposite_corners_).vector_.
                                                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                                 ._M_impl + (ulong)uVar12 * 4);
                  }
                  if (uVar14 != 0xffffffff) {
                    uVar14 = uVar14 + ((uVar14 * -0x55555555 < 0x55555556) - 1 | 2);
                  }
                  bVar20 = uVar14 == uVar13;
                  if (bVar20) {
LAB_001254fb:
                    iVar4 = 0;
                  }
                  else {
                    iVar4 = 1;
                    if (uVar14 != 0xffffffff) {
                      lVar7 = *(long *)&pAVar1[uVar11].connectivity_data.corner_to_vertex_map_.
                                        super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                        ._M_impl.super__Vector_impl_data;
                      do {
                        if (*(int *)(lVar7 + (ulong)uVar14 * 4) != *(int *)(lVar7 + uVar17 * 4)) {
                          iVar4 = 0xb;
                          local_7c = uVar14;
                          goto LAB_001255a8;
                        }
                        uVar14 = ((uVar14 * -0x55555555 < 0x55555556) - 1 | 2) + uVar14;
                        if (uVar14 != 0xffffffff) {
                          uVar14 = *(uint *)(*(long *)&(pCVar5->opposite_corners_).vector_.
                                                                                                              
                                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                                  ._M_impl + (ulong)uVar14 * 4);
                        }
                        if (uVar14 == 0xffffffff) {
                          uVar14 = 0xffffffff;
                        }
                        else {
                          uVar14 = ((uVar14 * -0x55555555 < 0x55555556) - 1 | 2) + uVar14;
                        }
                        bVar20 = uVar14 == uVar13;
                        if (bVar20) goto LAB_001254fb;
                      } while (uVar14 != 0xffffffff);
                    }
                    bVar20 = false;
                  }
LAB_001255a8:
                  if (!bVar20) goto LAB_001255d1;
                }
                uVar11 = (ulong)((int)uVar11 + 1);
              } while (uVar11 <= uVar8 && uVar8 - uVar11 != 0);
            }
            iVar4 = 0xb;
LAB_001255d1:
            uVar17 = (ulong)local_7c;
            if (iVar4 != 0xb) goto LAB_0012578e;
          }
          IVar16.value_ = (uint)uVar17;
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar17] =
               (int)((ulong)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2);
          local_58._M_elems[0].value_ = IVar16.value_;
          if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_78,
                       (iterator)
                       local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_58);
          }
          else {
            *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = IVar16.value_;
            local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          uVar8 = uVar17;
          if (IVar16.value_ != 0xffffffff) {
            uVar8 = (ulong)(((IVar16.value_ * -0x55555555 < 0x55555556) - 1 | 2) + IVar16.value_);
          }
          if ((int)uVar8 != -1) {
            uVar8 = (ulong)*(uint *)(*(long *)&(((this->corner_table_)._M_t.
                                                 super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                                 .super__Head_base<0UL,_draco::CornerTable_*,_false>
                                                ._M_head_impl)->opposite_corners_).vector_.
                                               super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                    + uVar8 * 4);
          }
          iVar4 = (int)uVar8;
          if (iVar4 != -1) {
            uVar8 = (ulong)(iVar4 + (((uint)(iVar4 * -0x55555555) < 0x55555556) - 1 | 2));
          }
          uVar13 = (uint)uVar8;
          while ((uVar3 = uVar8, iVar4 = 0, uVar13 != 0xffffffff &&
                 (iVar4 = 0, uVar13 != IVar16.value_))) {
            pAVar1 = (this->attribute_data_).
                     super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar7 = (long)(this->attribute_data_).
                          super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1;
            IVar18.value_ = (uint)uVar3;
            if (lVar7 != 0) {
              uVar8 = (lVar7 >> 6) * -0x3333333333333333;
              uVar13 = 1;
              uVar11 = 0;
              do {
                lVar7 = *(long *)&pAVar1[uVar11].connectivity_data.corner_to_vertex_map_.
                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                  ._M_impl;
                if (*(int *)(lVar7 + uVar3 * 4) != *(int *)(lVar7 + uVar17 * 4)) {
                  *(int *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + uVar3 * 4) =
                       (int)((ulong)((long)local_78.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 2);
                  local_58._M_elems[1].value_ = (uint)((ulong)local_58._M_elems._0_8_ >> 0x20);
                  local_58._M_elems[0].value_ = IVar18.value_;
                  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              (&local_78,
                               (iterator)
                               local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish,(int *)&local_58);
                  }
                  else {
                    *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish = IVar18.value_;
                    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         (pointer)((long)local_78.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish + 4);
                  }
                  goto LAB_0012572d;
                }
                uVar11 = (ulong)uVar13;
                uVar13 = uVar13 + 1;
              } while (uVar11 <= uVar8 && uVar8 - uVar11 != 0);
            }
            *(int *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + uVar3 * 4) =
                 *(pointer)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + uVar17 * 4);
LAB_0012572d:
            uVar8 = uVar3;
            if (IVar18.value_ != 0xffffffff) {
              uVar8 = (ulong)(((IVar18.value_ * -0x55555555 < 0x55555556) - 1 | 2) + IVar18.value_);
            }
            if ((int)uVar8 != -1) {
              uVar8 = (ulong)*(uint *)(*(long *)&(((this->corner_table_)._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                                  .
                                                  super__Head_base<0UL,_draco::CornerTable_*,_false>
                                                  ._M_head_impl)->opposite_corners_).vector_.
                                                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                      + uVar8 * 4);
            }
            iVar4 = (int)uVar8;
            if (iVar4 != -1) {
              uVar8 = (ulong)(iVar4 + (((uint)(iVar4 * -0x55555555) < 0x55555556) - 1 | 2));
            }
            uVar13 = (uint)uVar8;
            uVar17 = uVar3;
          }
        }
LAB_0012578e:
        if ((iVar4 != 10) && (iVar4 != 0)) {
          bVar20 = false;
          goto LAB_0012588f;
        }
        uVar15 = uVar15 + 1;
        pCVar5 = (this->corner_table_)._M_t.
                 super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                 .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
        lVar7 = *(long *)&(pCVar5->vertex_corners_).vector_.
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                          ._M_impl;
      } while ((long)uVar15 <
               (long)(int)((ulong)((long)*(pointer *)((long)&(pCVar5->vertex_corners_).vector_ + 8)
                                  - lVar7) >> 2));
      bVar20 = true;
    }
LAB_0012588f:
    if (bVar20 != false) {
      pMVar6 = this->decoder_;
      pMVar2 = (pMVar6->super_MeshDecoder).mesh_;
      if ((int)((ulong)((long)(pMVar2->faces_).vector_.
                              super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pMVar2->faces_).vector_.
                             super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555 != 0) {
        iVar4 = 0;
        FVar19.value_ = 0;
        do {
          local_58._M_elems[2].value_ = 0;
          local_58._M_elems[0].value_ = 0;
          local_58._M_elems[1].value_ = 0;
          lVar7 = 0;
          do {
            local_58._M_elems[lVar7].value_ =
                 local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(uint)(iVar4 + (int)lVar7)];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          Mesh::SetFace((pMVar6->super_MeshDecoder).mesh_,FVar19,&local_58);
          FVar19.value_ = FVar19.value_ + 1;
          pMVar6 = this->decoder_;
          pMVar2 = (pMVar6->super_MeshDecoder).mesh_;
          iVar4 = iVar4 + 3;
        } while (FVar19.value_ <
                 (uint)((int)((ulong)((long)(pMVar2->faces_).vector_.
                                            super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pMVar2->faces_).vector_.
                                           super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                       -0x55555555));
      }
      ((pMVar6->super_MeshDecoder).super_PointCloudDecoder.point_cloud_)->num_points_ =
           (ValueType)
           ((ulong)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2);
    }
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return bVar20;
}

Assistant:

bool MeshEdgebreakerDecoderImpl<TraversalDecoder>::AssignPointsToCorners(
    int num_connectivity_verts) {
  // Map between the existing and deduplicated point ids.
  // Note that at this point we have one point id for each corner of the
  // mesh so there is corner_table_->num_corners() point ids.
  decoder_->mesh()->SetNumFaces(corner_table_->num_faces());

  if (attribute_data_.empty()) {
    // We have connectivity for position only. In this case all vertex indices
    // are equal to point indices.
    for (FaceIndex f(0); f < decoder_->mesh()->num_faces(); ++f) {
      Mesh::Face face;
      const CornerIndex start_corner(3 * f.value());
      for (int c = 0; c < 3; ++c) {
        // Get the vertex index on the corner and use it as a point index.
        const int32_t vert_id = corner_table_->Vertex(start_corner + c).value();
        face[c] = vert_id;
      }
      decoder_->mesh()->SetFace(f, face);
    }
    decoder_->point_cloud()->set_num_points(num_connectivity_verts);
    return true;
  }
  // Else we need to deduplicate multiple attributes.

  // Map between point id and an associated corner id. Only one corner for
  // each point is stored. The corners are used to sample the attribute values
  // in the last stage of the deduplication.
  std::vector<int32_t> point_to_corner_map;
  // Map between every corner and their new point ids.
  std::vector<int32_t> corner_to_point_map(corner_table_->num_corners());
  for (int v = 0; v < corner_table_->num_vertices(); ++v) {
    CornerIndex c = corner_table_->LeftMostCorner(VertexIndex(v));
    if (c == kInvalidCornerIndex) {
      continue;  // Isolated vertex.
    }
    CornerIndex deduplication_first_corner = c;
    if (is_vert_hole_[v]) {
      // If the vertex is on a boundary, start deduplication from the left most
      // corner that is guaranteed to lie on the boundary.
      deduplication_first_corner = c;
    } else {
      // If we are not on the boundary we need to find the first seam (of any
      // attribute).
      for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
        if (!attribute_data_[i].connectivity_data.IsCornerOnSeam(c)) {
          continue;  // No seam for this attribute, ignore it.
        }
        // Else there needs to be at least one seam edge.

        // At this point, we use identity mapping between corners and point ids.
        const VertexIndex vert_id =
            attribute_data_[i].connectivity_data.Vertex(c);
        CornerIndex act_c = corner_table_->SwingRight(c);
        bool seam_found = false;
        while (act_c != c) {
          if (act_c == kInvalidCornerIndex) {
            return false;
          }
          if (attribute_data_[i].connectivity_data.Vertex(act_c) != vert_id) {
            // Attribute seam found. Stop.
            deduplication_first_corner = act_c;
            seam_found = true;
            break;
          }
          act_c = corner_table_->SwingRight(act_c);
        }
        if (seam_found) {
          break;  // No reason to process other attributes if we found a seam.
        }
      }
    }

    // Do a deduplication pass over the corners on the processed vertex.
    // At this point each corner corresponds to one point id and our goal is to
    // merge similar points into a single point id.
    // We do a single pass in a clockwise direction over the corners and we add
    // a new point id whenever one of the attributes change.
    c = deduplication_first_corner;
    // Create a new point.
    corner_to_point_map[c.value()] =
        static_cast<uint32_t>(point_to_corner_map.size());
    point_to_corner_map.push_back(c.value());
    // Traverse in CW direction.
    CornerIndex prev_c = c;
    c = corner_table_->SwingRight(c);
    while (c != kInvalidCornerIndex && c != deduplication_first_corner) {
      bool attribute_seam = false;
      for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
        if (attribute_data_[i].connectivity_data.Vertex(c) !=
            attribute_data_[i].connectivity_data.Vertex(prev_c)) {
          // Attribute index changed from the previous corner. We need to add a
          // new point here.
          attribute_seam = true;
          break;
        }
      }
      if (attribute_seam) {
        corner_to_point_map[c.value()] =
            static_cast<uint32_t>(point_to_corner_map.size());
        point_to_corner_map.push_back(c.value());
      } else {
        corner_to_point_map[c.value()] = corner_to_point_map[prev_c.value()];
      }
      prev_c = c;
      c = corner_table_->SwingRight(c);
    }
  }
  // Add faces.
  for (FaceIndex f(0); f < decoder_->mesh()->num_faces(); ++f) {
    Mesh::Face face;
    for (int c = 0; c < 3; ++c) {
      // Remap old points to the new ones.
      face[c] = corner_to_point_map[3 * f.value() + c];
    }
    decoder_->mesh()->SetFace(f, face);
  }
  decoder_->point_cloud()->set_num_points(
      static_cast<uint32_t>(point_to_corner_map.size()));
  return true;
}